

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::iterator::
overflow<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  iterator *piVar1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  uintptr_t intWord;
  NodeRef NVar6;
  BranchNode<unsigned_long,_8U,_false> *pBVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined4 in_register_00000034;
  uint32_t uVar13;
  uint32_t n;
  uint32_t uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t curSizes [4];
  uint32_t newSizes [4];
  BranchNode<unsigned_long,_8U,_false> *nodes [4];
  interval<unsigned_long> ival;
  uint32_t local_c8 [6];
  iterator *local_b0;
  uint32_t local_a8 [4];
  IndexPair local_98;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> local_90;
  ulong local_88;
  ulong local_80;
  allocator_type *local_78;
  iterator *local_70;
  ulong local_68 [4];
  ulong local_48;
  interval<unsigned_long> local_40;
  
  local_80 = CONCAT44(in_register_00000034,level);
  piVar1 = this + 8;
  lVar15 = (ulong)level * 0x10;
  uVar13 = *(uint32_t *)(*(long *)(this + 8) + 0xc + lVar15);
  local_78 = alloc;
  local_70 = this;
  local_90.value = (uintptr_t)IntervalMapDetails::Path::getLeftSibling((Path *)piVar1,level);
  if (local_90.value == 0) {
    uVar14 = 0;
  }
  else {
    uVar8 = (uint)local_90.value & 0x3f;
    uVar14 = uVar8 + 1;
    uVar13 = uVar13 + uVar8 + 1;
    local_68[0] = local_90.value & 0xffffffffffffffc0;
    local_c8[0] = uVar14;
  }
  bVar4 = local_90.value != 0;
  lVar9 = *(long *)piVar1;
  uVar2 = *(uint32_t *)(lVar9 + 8 + lVar15);
  local_c8[bVar4] = uVar2;
  uVar14 = uVar14 + uVar2;
  uVar11 = bVar4 + 1;
  local_68[bVar4] = *(ulong *)(lVar9 + lVar15);
  NVar6 = IntervalMapDetails::Path::getRightSibling((Path *)piVar1,(uint32_t)local_80);
  uVar8 = uVar11;
  if (NVar6.pip.value != 0) {
    uVar8 = (uint)NVar6.pip.value & 0x3f;
    local_c8[uVar11] = uVar8 + 1;
    uVar14 = uVar14 + uVar8 + 1;
    uVar8 = bVar4 | 2;
    local_68[uVar11] = (ulong)NVar6.pip.value & 0xffffffffffffffc0;
  }
  local_88 = 0;
  local_b0 = piVar1;
  if (uVar8 * 8 < uVar14 + 1) {
    uVar11 = uVar8 - 1;
    if (uVar8 == 1) {
      uVar11 = 1;
    }
    uVar16 = (ulong)uVar11;
    local_c8[uVar8] = local_c8[uVar16];
    local_68[uVar8] = local_68[uVar16];
    local_c8[uVar16] = 0;
    pBVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_78);
    local_68[uVar16] = (ulong)pBVar7;
    uVar8 = uVar8 + 1;
    local_88 = uVar16;
  }
  local_98 = IntervalMapDetails::distribute(uVar8,uVar14,8,local_a8,uVar13);
  if (uVar8 - 1 != 0) {
    uVar16 = (ulong)(uVar8 - 1);
    iVar12 = uVar8 - 2;
    local_48 = uVar16;
    do {
      iVar3 = iVar12;
      if (local_c8[uVar16] != local_a8[uVar16]) {
        do {
          if (iVar3 == -1) break;
          uVar13 = local_c8[iVar3];
          iVar5 = IntervalMapDetails::
                  NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                  ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                       *)local_68[uVar16],local_c8[uVar16],
                                      (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                       *)local_68[iVar3],uVar13,local_a8[uVar16] - local_c8[uVar16])
          ;
          local_c8[iVar3] = uVar13 - iVar5;
          uVar13 = local_c8[uVar16];
          local_c8[uVar16] = iVar5 + uVar13;
          iVar3 = iVar3 + -1;
        } while (iVar5 + uVar13 < local_a8[uVar16]);
      }
      uVar18 = local_48;
      uVar16 = uVar16 - 1;
      iVar12 = iVar12 + -1;
    } while ((int)uVar16 != 0);
    uVar17 = 1;
    uVar16 = 0;
    do {
      uVar10 = uVar17;
      if (local_c8[uVar16] != local_a8[uVar16]) {
        do {
          if (uVar8 <= uVar10) break;
          uVar13 = local_c8[uVar10];
          iVar12 = IntervalMapDetails::
                   NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                   ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                        *)local_68[uVar10],uVar13,
                                       (NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
                                        *)local_68[uVar16],local_c8[uVar16],
                                       local_c8[uVar16] - local_a8[uVar16]);
          local_c8[uVar10] = uVar13 + iVar12;
          uVar13 = local_c8[uVar16];
          local_c8[uVar16] = uVar13 - iVar12;
          uVar10 = uVar10 + 1;
        } while (uVar13 - iVar12 < local_a8[uVar16]);
      }
      uVar16 = uVar16 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar18);
  }
  uVar16 = local_80;
  if (local_90.value != 0) {
    IntervalMapDetails::Path::moveLeft((Path *)local_b0,(uint32_t)local_80);
  }
  local_90.value = local_88 & 0xffffffff;
  uVar17 = (ulong)local_98 & 0xffffffff;
  bVar4 = false;
  uVar18 = 0;
  while( true ) {
    uVar13 = (uint32_t)uVar16;
    if (uVar18 == local_90.value && (int)local_88 != 0) {
      uVar16 = local_68[uVar18];
      uVar11 = local_a8[uVar18];
      local_40.right = *(ulong *)(uVar16 + 0x48);
      if (1 < (ulong)uVar11) {
        lVar15 = 0;
        do {
          uVar10 = *(ulong *)(uVar16 + 0x58 + lVar15);
          if (local_40.right <= uVar10) {
            local_40.right = uVar10;
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)uVar11 * 0x10 + -0x10 != lVar15);
      }
      local_40.left = *(unsigned_long *)(uVar16 + 0x40);
      bVar4 = IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::insertNode
                        ((iterator *)local_70,uVar13,
                         (NodeRef)(uVar16 & 0xffffffffffffffc0 | (ulong)(uVar11 - 1)),&local_40,
                         local_78);
      uVar16 = (ulong)(uVar13 + bVar4);
    }
    else {
      uVar14 = local_a8[uVar18];
      lVar15 = *(long *)local_b0;
      *(uint32_t *)(lVar15 + 8 + (uVar16 & 0xffffffff) * 0x10) = uVar14;
      if (uVar13 != 0) {
        lVar9 = (ulong)(uVar13 - 1) * 0x10;
        uVar10 = (ulong)*(uint *)(lVar15 + 0xc + lVar9);
        lVar15 = *(long *)(lVar15 + lVar9);
        *(ulong *)(lVar15 + uVar10 * 8) =
             *(ulong *)(lVar15 + uVar10 * 8) & 0xffffffffffffffc0 | (ulong)(uVar14 - 1);
      }
      IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::recomputeBounds
                ((iterator *)local_70,uVar13);
    }
    piVar1 = local_b0;
    if (uVar18 + 1 == (ulong)uVar8) break;
    IntervalMapDetails::Path::moveRight((Path *)local_b0,(uint32_t)uVar16);
    uVar17 = (ulong)((int)uVar17 - 1);
    uVar18 = uVar18 + 1;
  }
  if ((uint)uVar18 != local_98.first) {
    do {
      IntervalMapDetails::Path::moveLeft((Path *)piVar1,(uint32_t)uVar16);
      uVar8 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  *(uint *)(*(long *)piVar1 + 0xc + (uVar16 & 0xffffffff) * 0x10) = local_98.second;
  return bVar4;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}